

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.h
# Opt level: O0

Any __thiscall Jinx::Impl::Script::GetUserContext(Script *this)

{
  _Storage extraout_RDX;
  long in_RSI;
  Any AVar1;
  Script *this_local;
  
  std::any::any((any *)this,(any *)(in_RSI + 0x10f0));
  AVar1._M_storage._M_ptr = extraout_RDX._M_ptr;
  AVar1._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return AVar1;
}

Assistant:

Any GetUserContext() const override { return m_userContext; }